

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

TanLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::TanLayerParams>(Arena *arena)

{
  TanLayerParams *pTVar1;
  
  if (arena != (Arena *)0x0) {
    pTVar1 = DoCreateMessage<CoreML::Specification::TanLayerParams>(arena);
    return pTVar1;
  }
  pTVar1 = (TanLayerParams *)operator_new(0x18);
  CoreML::Specification::TanLayerParams::TanLayerParams(pTVar1,(Arena *)0x0,false);
  return pTVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }